

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

void __thiscall
DataFilters::addStringFilter
          (DataFilters *this,uint *index,string *pattern,bool *isExact,bool *isSensitive,
          bool *isAccept)

{
  uint index_00;
  StringFilter local_90;
  StringFilterCase local_68;
  bool *local_38;
  bool *isAccept_local;
  bool *isSensitive_local;
  bool *isExact_local;
  string *pattern_local;
  uint *index_local;
  DataFilters *this_local;
  
  index_00 = *index;
  local_38 = isAccept;
  isAccept_local = isSensitive;
  isSensitive_local = isExact;
  isExact_local = (bool *)pattern;
  pattern_local = (string *)index;
  index_local = (uint *)this;
  StringFilter::StringFilter(&local_90,pattern,isExact,isSensitive,isAccept);
  StringFilterCase::StringFilterCase(&local_68,index_00,&local_90);
  std::vector<DataFilters::StringFilterCase,_std::allocator<DataFilters::StringFilterCase>_>::
  push_back(&this->_stringFilters,&local_68);
  StringFilterCase::~StringFilterCase(&local_68);
  StringFilter::~StringFilter(&local_90);
  return;
}

Assistant:

void
    addStringFilter(unsigned int const & index,
                    std::string const & pattern,
                    bool const & isExact,
                    bool const & isSensitive,
                    bool const & isAccept)
    {
        this->_stringFilters.push_back(StringFilterCase(index, StringFilter(pattern, isExact, isSensitive, isAccept)));
    }